

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::clearTimeBarrier(CoreBroker *this)

{
  ActionMessage tbarrier;
  ActionMessage AStack_c8;
  
  ActionMessage::ActionMessage(&AStack_c8,cmd_time_barrier_request);
  AStack_c8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  AStack_c8.actionTime.internalTimeCode = 0x7fffffffffffffff;
  AStack_c8.flags._1_1_ = AStack_c8.flags._1_1_ | 0x20;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_c8);
  ActionMessage::~ActionMessage(&AStack_c8);
  return;
}

Assistant:

void CoreBroker::clearTimeBarrier()
{
    ActionMessage tbarrier(CMD_TIME_BARRIER_REQUEST);
    tbarrier.source_id = global_id.load();
    tbarrier.actionTime = Time::maxVal();
    setActionFlag(tbarrier, cancel_flag);
    addActionMessage(tbarrier);
}